

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_entry_list_t.c
# Opt level: O0

MMDB_entry_data_list_s * test_mapX_key_value_pair(MMDB_entry_data_list_s *entry_data_list)

{
  MMDB_entry_data_s entry_data;
  MMDB_entry_data_s entry_data_00;
  int iVar1;
  char *__s1;
  char *__s1_00;
  undefined8 uVar2;
  undefined8 in_stack_ffffffffffffffc8;
  char *utf8_stringX_value;
  MMDB_entry_data_list_s *mapX_value;
  char *mapX_key_name;
  MMDB_entry_data_list_s *mapX_key;
  MMDB_entry_data_list_s *entry_data_list_local;
  
  mapX_key = entry_data_list->next;
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0xa3,(mapX_key->entry_data).type,"==",2,"found a map key in \'map{mapX}\'",0);
  uVar2 = *(undefined8 *)&mapX_key->entry_data;
  entry_data.data_size = (int)in_stack_ffffffffffffffc8;
  entry_data.type = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  entry_data._0_40_ = *(undefined1 (*) [40])&(mapX_key->entry_data).field_0x8;
  __s1 = dup_entry_string_or_bail(entry_data);
  iVar1 = strcmp(__s1,"utf8_stringX");
  if (iVar1 == 0) {
    mapX_key = mapX_key->next;
    cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                  ,0xac,(mapX_key->entry_data).type,"==",2,
                  "\'map{mapX}{utf8_stringX}\' type is utf8_string",0);
    entry_data_00.data_size = (int)in_stack_ffffffffffffffc8;
    entry_data_00.type = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
    entry_data_00._0_40_ = *(undefined1 (*) [40])&(mapX_key->entry_data).field_0x8;
    __s1_00 = dup_entry_string_or_bail(entry_data_00);
    iVar1 = strcmp(__s1_00,"hello");
    ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
              ,0xb0,(uint)(iVar1 == 0),"map{mapX}{utf8_stringX} value is \'hello\'",0);
    free(__s1_00);
  }
  else {
    iVar1 = strcmp(__s1,"arrayX");
    if (iVar1 == 0) {
      mapX_key = test_arrayX_value(mapX_key);
    }
    else {
      ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0xb5,0,"unknown key found in map{mapX} - %s",__s1,0,uVar2);
    }
  }
  free(__s1);
  return mapX_key;
}

Assistant:

MMDB_entry_data_list_s *
test_mapX_key_value_pair(MMDB_entry_data_list_s *entry_data_list) {
    MMDB_entry_data_list_s *mapX_key = entry_data_list = entry_data_list->next;
    cmp_ok(mapX_key->entry_data.type,
           "==",
           MMDB_DATA_TYPE_UTF8_STRING,
           "found a map key in 'map{mapX}'");
    char *mapX_key_name = dup_entry_string_or_bail(mapX_key->entry_data);

    if (strcmp(mapX_key_name, "utf8_stringX") == 0) {
        MMDB_entry_data_list_s *mapX_value = entry_data_list =
            entry_data_list->next;
        cmp_ok(mapX_value->entry_data.type,
               "==",
               MMDB_DATA_TYPE_UTF8_STRING,
               "'map{mapX}{utf8_stringX}' type is utf8_string");
        char *utf8_stringX_value =
            dup_entry_string_or_bail(mapX_value->entry_data);
        ok(strcmp(utf8_stringX_value, "hello") == 0,
           "map{mapX}{utf8_stringX} value is 'hello'");
        free(utf8_stringX_value);
    } else if (strcmp(mapX_key_name, "arrayX") == 0) {
        entry_data_list = test_arrayX_value(entry_data_list);
    } else {
        ok(0, "unknown key found in map{mapX} - %s", mapX_key_name);
    }

    free(mapX_key_name);

    return entry_data_list;
}